

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void textsize_cb(Fl_Value_Input *i,void *v)

{
  Fl_Type *pFVar1;
  bool bVar2;
  int iVar3;
  Fl_Widget_Type *q;
  Fl_Type **ppFVar4;
  int s;
  Fl_Color c;
  Fl_Font n;
  Fl_Value_Input *local_38;
  
  if ((char *)v == "LOAD") {
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x2b])(current_widget,0,&n,&s,&c);
    if (iVar3 == 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
  }
  else {
    s = (int)(i->super_Fl_Valuator).value_;
    if (s < 1) {
      s = Fl_Widget_Type::default_size;
    }
    bVar2 = false;
    ppFVar4 = &Fl_Type::first;
    local_38 = i;
    while (i = local_38, pFVar1 = *ppFVar4, pFVar1 != (Fl_Type *)0x0) {
      if ((pFVar1->selected != '\0') && (iVar3 = (*pFVar1->_vptr_Fl_Type[0x17])(pFVar1), iVar3 != 0)
         ) {
        (*pFVar1->_vptr_Fl_Type[0x2b])(pFVar1,2,&n,&s,&c);
        Fl_Widget::redraw((Fl_Widget *)pFVar1[1].prev);
        bVar2 = true;
      }
      ppFVar4 = &pFVar1->next;
    }
    if (bVar2) {
      set_modflag(1);
    }
  }
  Fl_Valuator::value(&i->super_Fl_Valuator,(double)s);
  return;
}

Assistant:

void textsize_cb(Fl_Value_Input* i, void* v) {
  Fl_Font n; int s; Fl_Color c;
  if (v == LOAD) {
    if (!current_widget->textstuff(0,n,s,c)) {i->deactivate(); return;}
    i->activate();
  } else {
    int mod = 0;
    s = int(i->value());
    if (s <= 0) s = Fl_Widget_Type::default_size;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->textstuff(2,n,s,c);
	q->o->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
  i->value(s);
}